

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
* __thiscall
cmCTest::Private::GetNamedTestingHandlers_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
           *__return_storage_ptr__,Private *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  *local_250;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  local_222;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_221;
  cmCTestUploadHandler *local_220;
  cmCTestSubmitHandler *local_218;
  cmCTestMemCheckHandler *local_210;
  cmCTestConfigureHandler *local_208;
  cmCTestUpdateHandler *local_200;
  cmCTestTestHandler *local_1f8;
  cmCTestScriptHandler *local_1f0;
  cmCTestCoverageHandler *local_1e8;
  cmCTestBuildAndTestHandler *local_1e0 [3];
  cmCTestBuildHandler *local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  *local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_50;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  Private *this_local;
  
  local_1c0 = &local_1b8;
  local_1c8 = &this->BuildHandler;
  local_18 = (undefined1  [8])this;
  this_local = (Private *)__return_storage_ptr__;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[6],_cmCTestBuildHandler_*,_true>
            (local_1c0,(char (*) [6])0xd129f9,&local_1c8);
  local_1c0 = &local_190;
  local_1e0[0] = &this->BuildAndTestHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[10],_cmCTestBuildAndTestHandler_*,_true>
            (local_1c0,(char (*) [10])"buildtest",local_1e0);
  local_1c0 = &local_168;
  local_1e8 = &this->CoverageHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[9],_cmCTestCoverageHandler_*,_true>
            (local_1c0,(char (*) [9])0xd12a0c,&local_1e8);
  local_1c0 = &local_140;
  local_1f0 = &this->ScriptHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[7],_cmCTestScriptHandler_*,_true>
            (local_1c0,(char (*) [7])0xd12798,&local_1f0);
  local_1c0 = &local_118;
  local_1f8 = &this->TestHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[5],_cmCTestTestHandler_*,_true>(local_1c0,(char (*) [5])0xd12a03,&local_1f8)
  ;
  local_1c0 = &local_f0;
  local_200 = &this->UpdateHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[7],_cmCTestUpdateHandler_*,_true>
            (local_1c0,(char (*) [7])0xd129e0,&local_200);
  local_1c0 = &local_c8;
  local_208 = &this->ConfigureHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[10],_cmCTestConfigureHandler_*,_true>
            (local_1c0,(char (*) [10])0xd129eb,&local_208);
  local_1c0 = &local_a0;
  local_210 = &this->MemCheckHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[9],_cmCTestMemCheckHandler_*,_true>
            (local_1c0,(char (*) [9])0xd12a19,&local_210);
  local_1c0 = &local_78;
  local_218 = &this->SubmitHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[7],_cmCTestSubmitHandler_*,_true>
            (local_1c0,(char (*) [7])0xd12a30,&local_218);
  local_1c0 = &local_50;
  local_220 = &this->UploadHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[7],_cmCTestUploadHandler_*,_true>
            (local_1c0,(char (*) [7])0xd18e1f,&local_220);
  local_28 = &local_1b8;
  local_20 = 10;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  ::allocator(&local_222);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
  ::map(__return_storage_ptr__,__l,&local_221,&local_222);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  ::~allocator(&local_222);
  local_250 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
               *)&local_28;
  do {
    local_250 = local_250 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
    ::~pair(local_250);
  } while (local_250 != &local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, cmCTestGenericHandler*> GetNamedTestingHandlers()
  {
    return { { "build", &this->BuildHandler },
             { "buildtest", &this->BuildAndTestHandler },
             { "coverage", &this->CoverageHandler },
             { "script", &this->ScriptHandler },
             { "test", &this->TestHandler },
             { "update", &this->UpdateHandler },
             { "configure", &this->ConfigureHandler },
             { "memcheck", &this->MemCheckHandler },
             { "submit", &this->SubmitHandler },
             { "upload", &this->UploadHandler } };
  }